

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::
emplaceRealloc<slang::ast::PrimitiveSymbol::TableEntry>
          (SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *this,pointer pos,
          TableEntry *args)

{
  ulong uVar1;
  size_t *psVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  undefined5 uVar6;
  TableEntry *__cur_1;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  EVP_PKEY_CTX *pEVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  pEVar11 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar11 < ctx) {
    pEVar11 = ctx;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    pEVar11 = (EVP_PKEY_CTX *)0x555555555555555;
  }
  lVar12 = (long)pos - (long)this->data_;
  pTVar7 = (pointer)operator_new((long)pEVar11 * 0x18);
  *(undefined8 *)((long)pTVar7 + lVar12 + 0x10) = *(undefined8 *)&args->state;
  pcVar3 = (args->inputs)._M_str;
  *(size_t *)((long)pTVar7 + lVar12) = (args->inputs)._M_len;
  ((size_t *)((long)pTVar7 + lVar12))[1] = (size_t)pcVar3;
  pTVar10 = this->data_;
  pTVar8 = pTVar10 + this->len;
  pTVar9 = pTVar7;
  if (pTVar8 == pos) {
    for (; pTVar10 != pos; pTVar10 = pTVar10 + 1) {
      cVar4 = pTVar10->output;
      bVar5 = pTVar10->isEdgeSensitive;
      uVar6 = *(undefined5 *)&pTVar10->field_0x13;
      pTVar9->state = pTVar10->state;
      pTVar9->output = cVar4;
      pTVar9->isEdgeSensitive = bVar5;
      *(undefined5 *)&pTVar9->field_0x13 = uVar6;
      pcVar3 = (pTVar10->inputs)._M_str;
      (pTVar9->inputs)._M_len = (pTVar10->inputs)._M_len;
      (pTVar9->inputs)._M_str = pcVar3;
      pTVar9 = pTVar9 + 1;
    }
  }
  else {
    for (; pTVar10 != pos; pTVar10 = pTVar10 + 1) {
      ctx = *(EVP_PKEY_CTX **)&pTVar10->state;
      *(EVP_PKEY_CTX **)&pTVar9->state = ctx;
      pcVar3 = (pTVar10->inputs)._M_str;
      (pTVar9->inputs)._M_len = (pTVar10->inputs)._M_len;
      (pTVar9->inputs)._M_str = pcVar3;
      pTVar9 = pTVar9 + 1;
    }
    psVar2 = (size_t *)(lVar12 + (long)pTVar7);
    for (; pos != pTVar8; pos = pos + 1) {
      psVar2[5] = *(size_t *)&pos->state;
      pcVar3 = (pos->inputs)._M_str;
      psVar2[3] = (pos->inputs)._M_len;
      psVar2[4] = (size_t)pcVar3;
      psVar2 = psVar2 + 3;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar11;
  this->data_ = pTVar7;
  return (pointer)((long)pTVar7 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}